

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O2

void __thiscall hnsw::HNSWIndex::Insert(HNSWIndex *this,index_t q)

{
  uint uVar1;
  pointer pVVar2;
  pointer ppfVar3;
  float *q_00;
  long lVar4;
  pointer ppVar5;
  layer_t lVar6;
  int iVar7;
  long lVar8;
  uint32_t *puVar9;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *this_00;
  uint32_t uVar10;
  ulong uVar11;
  Vertex *this_01;
  Point *p;
  pointer ppVar12;
  Point ep;
  PointSet selected_points;
  MaxHeap candidates;
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  local_48;
  
  pVVar2 = (this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pVVar2[q].layer != 0) ||
     (this_01 = pVVar2 + q,
     (this_01->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (this_01->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("vertex.layer == 0 && vertex.neighbors.size() == 0 && \"Vertex has already been inserted\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/include/hnsw.hpp"
                  ,0x5a,"void hnsw::HNSWIndex::Insert(index_t)");
  }
  lVar6 = RandomChoiceLayer(this);
  this_01->layer = lVar6;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::resize(&this_01->neighbors,(long)(lVar6 + 1));
  this_00 = (this_01->neighbors).
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1,
        this_00 !=
        (this_01->neighbors).
        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(this_00,(ulong)this->maxM_);
  }
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve((this_01->neighbors).
          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start,(ulong)this->maxM0_);
  uVar10 = this->num_points_;
  this->num_points_ = uVar10 + 1;
  if (uVar10 == 0) {
    iVar7 = this_01->layer;
  }
  else {
    ppfVar3 = (this->points_).row_ptrs_.
              super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    q_00 = ppfVar3[q];
    (**this->distance_->_vptr_Distance)(this->distance_,q_00,ppfVar3[this->ep_]);
    ep.first = this->ep_;
    for (lVar6 = this->top_layer_; uVar1 = this_01->layer, (int)uVar1 < lVar6; lVar6 = lVar6 + -1) {
      SearchUpperLayer(this,q_00,&ep,lVar6);
    }
    uVar11 = (ulong)uVar1;
    if (this->top_layer_ < (int)uVar1) {
      uVar11 = (ulong)(uint)this->top_layer_;
    }
    while( true ) {
      uVar10 = (uint32_t)uVar11;
      if ((int)uVar10 < 0) break;
      puVar9 = &this->maxM_;
      if (uVar10 == 0) {
        puVar9 = &this->maxM0_;
      }
      uVar1 = *puVar9;
      SearchLayer(&candidates,this,q_00,&ep,this->ef_construction_,uVar10);
      SelectNeighborsHeuristic(&selected_points,this,q_00,(PointSet *)&candidates,this->M_);
      ppVar5 = selected_points.
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = uVar11 * 0x18;
      for (ppVar12 = selected_points.
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar5;
          ppVar12 = ppVar12 + 1) {
        Vertex::ConnectTo((this->vertices_).
                          super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start + ppVar12->first,q,
                          ppVar12->second,uVar10);
        Vertex::ConnectTo(this_01,ppVar12->first,ppVar12->second,uVar10);
        lVar4 = *(long *)&(this->vertices_).
                          super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start[ppVar12->first].neighbors.
                          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                          ._M_impl;
        if ((ulong)uVar1 < (ulong)(*(long *)(lVar4 + 8 + lVar8) - *(long *)(lVar4 + lVar8) >> 3)) {
          SelectNeighborsHeuristic
                    ((PointSet *)&local_48,this,
                     (this->points_).row_ptrs_.
                     super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                     super__Vector_impl_data._M_start[ppVar12->first],(PointSet *)(lVar4 + lVar8),
                     uVar1);
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          _M_move_assign((PointSet *)(lVar4 + lVar8),&local_48);
          std::
          _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ::~_Vector_base(&local_48);
        }
      }
      std::
      _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::~_Vector_base(&selected_points.
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     );
      std::
      _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       *)&candidates);
      uVar11 = (ulong)(uVar10 - 1);
    }
    iVar7 = this_01->layer;
    if (iVar7 <= this->top_layer_) {
      return;
    }
  }
  this->top_layer_ = iVar7;
  this->ep_ = q;
  return;
}

Assistant:

void Insert(index_t q) {
    Vertex &vertex = vertices_[q];
    assert(vertex.layer == 0 && vertex.neighbors.size() == 0 && "Vertex has already been inserted");
    vertex.layer = RandomChoiceLayer();
    vertex.neighbors.resize(vertex.layer + 1);
    for (auto iter = vertex.neighbors.begin() + 1; iter != vertex.neighbors.end(); iter++) {
      iter->reserve(maxM_);
    }
    vertex.neighbors[0].reserve(maxM0_);

    num_points_ += 1;

    if (num_points_ == 1) {
      top_layer_ = vertex.layer;
      ep_ = q;
      return;
    }

    const float *query = points_[q];
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > vertex.layer; l--) {
      SearchUpperLayer(query, ep, l);
    }

    // Search neighbors and connect to them
    for (layer_t l = std::min(vertex.layer, top_layer_); l >= 0; l--) {
      uint32_t maxM = (l == 0) ? maxM0_ : maxM_;
      MaxHeap candidates = SearchLayer(query, ep, ef_construction_, l);
      PointSet selected_points =
          SelectNeighborsHeuristic(query, candidates.Container(), M_);  // next ep

      for (const Point &p : selected_points) {
        vertices_[p.first].ConnectTo(q, p.second, l);
        vertex.ConnectTo(p.first, p.second, l);

        // Shrink neighbors
        auto &edges = vertices_[p.first].neighbors[l];
        if (edges.size() > maxM) {
          edges = SelectNeighborsHeuristic(points_[p.first], edges, maxM);
        }
      }
    }

    if (vertex.layer > top_layer_) {
      top_layer_ = vertex.layer;
      ep_ = q;
    }

    return;
  }